

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asio_service.cxx
# Opt level: O1

void __thiscall
nuraft::asio_rpc_client::asio_rpc_client
          (asio_rpc_client *this,asio_service_impl *_impl,io_service *io_svc,ssl_context *ssl_ctx,
          string *host,string *port,bool ssl_enabled,ptr<logger> *l)

{
  ssl_socket *this_00;
  atomic<unsigned_long> *paVar1;
  __int_type _Var2;
  pointer pcVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  element_type *peVar5;
  int iVar6;
  string local_68;
  _Bind<bool_(nuraft::asio_rpc_client::*(nuraft::asio_rpc_client_*,_std::_Placeholder<1>,_std::_Placeholder<2>))(bool,_asio::ssl::verify_context_&)>
  local_48;
  
  (this->super_enable_shared_from_this<nuraft::asio_rpc_client>)._M_weak_this.
  super___weak_ptr<nuraft::asio_rpc_client,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0
  ;
  (this->super_enable_shared_from_this<nuraft::asio_rpc_client>)._M_weak_this.
  super___weak_ptr<nuraft::asio_rpc_client,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->super_rpc_client)._vptr_rpc_client = (_func_int **)&PTR__asio_rpc_client_005be9c0;
  this->impl_ = _impl;
  asio::detail::io_object_impl<asio::detail::resolver_service<asio::ip::tcp>,_asio::any_io_executor>
  ::io_object_impl<asio::io_context>(&(this->resolver_).impl_,0,0,io_svc);
  asio::detail::
  io_object_impl<asio::detail::reactive_socket_service<asio::ip::tcp>,_asio::any_io_executor>::
  io_object_impl<asio::io_context>
            ((io_object_impl<asio::detail::reactive_socket_service<asio::ip::tcp>,_asio::any_io_executor>
              *)&this->socket_,0,0,io_svc);
  this_00 = &this->ssl_socket_;
  asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,asio::any_io_executor>&>::
  stream<asio::basic_stream_socket<asio::ip::tcp,asio::any_io_executor>&>
            ((stream<asio::basic_stream_socket<asio::ip::tcp,asio::any_io_executor>&> *)this_00,
             &this->socket_,ssl_ctx);
  (this->attempting_conn_)._M_base._M_i = false;
  (this->host_)._M_dataplus._M_p = (pointer)&(this->host_).field_2;
  pcVar3 = (host->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->host_,pcVar3,pcVar3 + host->_M_string_length);
  (this->port_)._M_dataplus._M_p = (pointer)&(this->port_).field_2;
  pcVar3 = (port->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->port_,pcVar3,pcVar3 + port->_M_string_length);
  this->ssl_enabled_ = ssl_enabled;
  (this->ssl_ready_)._M_base._M_i = false;
  (this->num_send_fails_).super___atomic_base<unsigned_long>._M_i = 0;
  this->abandoned_ = (__atomic_base<bool>)0x0;
  this->socket_busy_ = (__atomic_base<bool>)0x0;
  asio::detail::
  io_object_impl<asio::detail::deadline_timer_service<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>,_asio::any_io_executor>
  ::io_object_impl<asio::io_context>(&(this->operation_timer_).impl_,0,0,io_svc);
  (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (l->super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  p_Var4 = (l->super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       p_Var4;
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
    }
  }
  LOCK();
  paVar1 = &this->impl_->client_id_counter_;
  _Var2 = (paVar1->super___atomic_base<unsigned_long>)._M_i;
  (paVar1->super___atomic_base<unsigned_long>)._M_i =
       (paVar1->super___atomic_base<unsigned_long>)._M_i + 1;
  UNLOCK();
  this->client_id_ = _Var2;
  if (this->ssl_enabled_ == true) {
    asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_&>::
    set_verify_mode(this_00,(_impl->my_opt_).skip_verification_ ^ 1);
    local_48._M_f = (offset_in_asio_rpc_client_to_subr)verify_certificate;
    local_48._8_8_ = 0;
    local_48._M_bound_args.
    super__Tuple_impl<0UL,_nuraft::asio_rpc_client_*,_std::_Placeholder<1>,_std::_Placeholder<2>_>.
    super__Head_base<0UL,_nuraft::asio_rpc_client_*,_false>._M_head_impl =
         (_Tuple_impl<0UL,_nuraft::asio_rpc_client_*,_std::_Placeholder<1>,_std::_Placeholder<2>_>)
         (_Tuple_impl<0UL,_nuraft::asio_rpc_client_*,_std::_Placeholder<1>,_std::_Placeholder<2>_>)
         this;
    asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,asio::any_io_executor>&>::
    set_verify_callback<std::_Bind<bool(nuraft::asio_rpc_client::*(nuraft::asio_rpc_client*,std::_Placeholder<1>,std::_Placeholder<2>))(bool,asio::ssl::verify_context&)>>
              ((stream<asio::basic_stream_socket<asio::ip::tcp,asio::any_io_executor>&> *)this_00,
               &local_48);
  }
  peVar5 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar5 != (element_type *)0x0) {
    iVar6 = (**(code **)(*(long *)peVar5 + 0x38))();
    if (5 < iVar6) {
      peVar5 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      msg_if_given_abi_cxx11_(&local_68,"asio client created: %p",this);
      (**(code **)(*(long *)peVar5 + 0x40))
                (peVar5,6,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/asio_service.cxx"
                 ,"asio_rpc_client",0x39f,&local_68);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_dataplus._M_p != &local_68.field_2) {
        operator_delete(local_68._M_dataplus._M_p);
      }
    }
  }
  return;
}

Assistant:

asio_rpc_client(asio_service_impl* _impl,
                    asio::io_service& io_svc,
                    ssl_context& ssl_ctx,
                    std::string& host,
                    std::string& port,
                    bool ssl_enabled,
                    ptr<logger> l)
        : impl_(_impl)
        , resolver_(io_svc)
        , socket_(io_svc)
        , ssl_socket_(socket_, ssl_ctx)
        , attempting_conn_(false)
        , host_(host)
        , port_(port)
        , ssl_enabled_(ssl_enabled)
        , ssl_ready_(false)
        , num_send_fails_(0)
        , abandoned_(false)
        , socket_busy_(false)
        , operation_timer_(io_svc)
        , l_(l)
    {
        client_id_ = impl_->assign_client_id();
        if (ssl_enabled_) {
#ifdef SSL_LIBRARY_NOT_FOUND
            assert(0); // Should not reach here.
#else
            if (_impl->get_options().skip_verification_) {
                ssl_socket_.set_verify_mode(asio::ssl::verify_none);
            } else {
                ssl_socket_.set_verify_mode(asio::ssl::verify_peer);
            }

            ssl_socket_.set_verify_callback
                        ( std::bind( &asio_rpc_client::verify_certificate,
                                     this,
                                     std::placeholders::_1,
                                     std::placeholders::_2 ) );
#endif
        }
        p_tr("asio client created: %p", this);
    }